

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O1

void __thiscall
llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::
OptionalStorage(OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *this,
               OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *O)

{
  bool bVar1;
  code *pcVar2;
  AlignedCharArrayUnion<std::function<void_(llbuild::basic::ProcessResult)>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
  *pAVar3;
  
  bVar1 = O->hasVal;
  this->hasVal = bVar1;
  if (bVar1 == true) {
    if (O->hasVal == false) {
      __assert_fail("hasVal",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Optional.h"
                    ,0x6a,
                    "const T *llvm::optional_detail::OptionalStorage<std::function<void (llbuild::basic::ProcessResult)>, false>::getPointer() const [T = std::function<void (llbuild::basic::ProcessResult)>, IsPodLike = false]"
                   );
    }
    pAVar3 = &this->storage;
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x10] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x11] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x12] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x13] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x14] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x15] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x16] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x17] = '\0';
    pAVar3 = &this->storage;
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x18] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x19] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x1a] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x1b] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x1c] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x1d] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x1e] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0x1f] = '\0';
    (this->storage).super_AlignedCharArray<8UL,_32UL>.buffer[0] = '\0';
    (this->storage).super_AlignedCharArray<8UL,_32UL>.buffer[1] = '\0';
    (this->storage).super_AlignedCharArray<8UL,_32UL>.buffer[2] = '\0';
    (this->storage).super_AlignedCharArray<8UL,_32UL>.buffer[3] = '\0';
    (this->storage).super_AlignedCharArray<8UL,_32UL>.buffer[4] = '\0';
    (this->storage).super_AlignedCharArray<8UL,_32UL>.buffer[5] = '\0';
    (this->storage).super_AlignedCharArray<8UL,_32UL>.buffer[6] = '\0';
    (this->storage).super_AlignedCharArray<8UL,_32UL>.buffer[7] = '\0';
    pAVar3 = &this->storage;
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[8] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[9] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[10] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0xb] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0xc] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0xd] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0xe] = '\0';
    (pAVar3->super_AlignedCharArray<8UL,_32UL>).buffer[0xf] = '\0';
    pcVar2 = *(code **)((O->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x10);
    if (pcVar2 != (code *)0x0) {
      (*pcVar2)(this,O,2);
      *(undefined8 *)((this->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x18) =
           *(undefined8 *)((O->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x18);
      *(undefined8 *)((this->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x10) =
           *(undefined8 *)((O->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x10);
    }
  }
  return;
}

Assistant:

OptionalStorage(const OptionalStorage &O) : hasVal(O.hasVal) {
    if (hasVal)
      new (storage.buffer) T(*O.getPointer());
  }